

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O3

SignatureData *
DataFromTransaction(SignatureData *__return_storage_ptr__,CMutableTransaction *tx,uint nIn,
                   CTxOut *txout)

{
  CScript *this;
  CScriptWitness *witness;
  pointer pCVar1;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var2;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  _Var3;
  pointer puVar4;
  long lVar5;
  pointer pvVar6;
  pointer pvVar7;
  bool bVar8;
  TxoutType TVar9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar10;
  const_iterator cVar11;
  ulong uVar12;
  ulong uVar13;
  iterator __begin2;
  pointer pvVar14;
  uint uVar15;
  CScript *other;
  long in_FS_OFFSET;
  iterator __end2;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  solutions;
  SignatureExtractorChecker extractor_checker;
  MutableTransactionSignatureChecker tx_checker;
  SigVersion local_180;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_158;
  SignatureExtractorChecker local_138;
  BaseSignatureChecker local_120;
  CMutableTransaction *local_118;
  undefined4 local_110;
  uint local_10c;
  CAmount local_108;
  undefined8 local_100;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_f8;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_e0;
  direct_or_indirect local_c0;
  uint local_a4;
  direct_or_indirect local_78;
  uint local_5c;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  SignatureData::SignatureData(__return_storage_ptr__);
  pCVar1 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar13 = ((long)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pCVar1 >> 3) * 0x4ec4ec4ec4ec4ec5;
  uVar12 = (ulong)nIn;
  if (uVar13 < uVar12 || uVar13 - uVar12 == 0) {
    __assert_fail("tx.vin.size() > nIn",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/sign.cpp"
                  ,0x265,
                  "SignatureData DataFromTransaction(const CMutableTransaction &, unsigned int, const CTxOut &)"
                 );
  }
  this = &__return_storage_ptr__->scriptSig;
  prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
            (&this->super_CScriptBase,&pCVar1[uVar12].scriptSig.super_CScriptBase);
  witness = &__return_storage_ptr__->scriptWitness;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::operator=(&witness->stack,
              &(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start[uVar12].scriptWitness.stack);
  local_f8.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  local_f8.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  local_f8.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::vector(&local_e0,&witness->stack);
  local_c0.indirect_contents.indirect = (char *)&PTR_CheckECDSASignature_00b2a760;
  EvalScript(&local_f8,this,2,(BaseSignatureChecker *)&local_c0,BASE,(ScriptError *)0x0);
  local_138.super_DeferringSignatureChecker.m_checker = &local_120;
  local_120._vptr_BaseSignatureChecker = (_func_int **)&PTR_CheckECDSASignature_00b2a7a0;
  local_110 = 1;
  local_108 = txout->nValue;
  local_100 = 0;
  local_138.super_DeferringSignatureChecker.super_BaseSignatureChecker._vptr_BaseSignatureChecker =
       (_func_int **)&PTR_CheckECDSASignature_00b2b788;
  other = &txout->scriptPubKey;
  local_138.sigdata = __return_storage_ptr__;
  local_118 = tx;
  local_10c = nIn;
  bVar8 = VerifyScript(this,other,witness,0x1fffdf,(BaseSignatureChecker *)&local_138,
                       (ScriptError *)0x0);
  if (bVar8) {
    __return_storage_ptr__->complete = true;
    goto LAB_0072a113;
  }
  local_158.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.
  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  TVar9 = Solver(other,&local_158);
  prevector<28U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_78.indirect_contents,
             &other->super_CScriptBase);
  if (TVar9 == SCRIPTHASH) {
    if (local_f8.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_f8.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      _Var2._M_current =
           local_f8.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      _Var3._M_current =
           local_f8.
           super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (_Var2._M_current != _Var3._M_current) {
        prevector<28U,_unsigned_char,_unsigned_int,_int>::
        prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_c0,_Var2,_Var3);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  (&(__return_storage_ptr__->redeem_script).super_CScriptBase,
                   (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_c0);
        if (0x1c < local_5c) {
          free(local_78.indirect_contents.indirect);
        }
        local_78._20_8_ = local_c0._20_8_;
        local_78.indirect_contents.indirect = local_c0.indirect_contents.indirect;
        local_5c = local_a4;
        local_a4 = 0;
        TVar9 = Solver((CScript *)&local_78.indirect_contents,&local_158);
        puVar4 = local_f8.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1].
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pvVar10 = local_f8.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish + -1;
        if (puVar4 != (pointer)0x0) {
          pvVar10 = local_f8.
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -1;
          local_f8.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_f8.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
          operator_delete(puVar4,(long)(pvVar10->
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)puVar4);
          pvVar10 = local_f8.
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        local_f8.
        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pvVar10;
        if (0x1c < local_a4) {
          free(local_c0.indirect_contents.indirect);
        }
        goto LAB_00729e35;
      }
    }
  }
  else {
LAB_00729e35:
    local_180 = BASE;
    if (TVar9 == WITNESS_V0_SCRIPTHASH) {
      if (local_e0.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_e0.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        _Var2._M_current =
             local_e0.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
        _Var3._M_current =
             local_e0.
             super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (_Var2._M_current != _Var3._M_current) {
          prevector<28U,_unsigned_char,_unsigned_int,_int>::
          prevector<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_c0,_Var2,_Var3);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                    (&(__return_storage_ptr__->witness_script).super_CScriptBase,
                     (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&local_c0);
          if (0x1c < local_5c) {
            free(local_78.indirect_contents.indirect);
          }
          local_78._20_8_ = local_c0._20_8_;
          local_78.indirect_contents.indirect = local_c0.indirect_contents.indirect;
          local_5c = local_a4;
          local_a4 = 0;
          TVar9 = Solver((CScript *)&local_78.indirect_contents,&local_158);
          puVar4 = local_e0.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish[-1].
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pvVar10 = local_e0.
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish + -1;
          if (puVar4 != (pointer)0x0) {
            pvVar10 = local_e0.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -1;
            local_e0.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_e0.
                 super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1;
            operator_delete(puVar4,(long)(pvVar10->
                                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                         )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)puVar4);
            pvVar10 = local_e0.
                      super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          }
          local_58.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_f8.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_58.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_f8.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_f8.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               local_e0.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
          local_f8.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               local_e0.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_58.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_f8.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          local_e0.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
          local_e0.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
          local_e0.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_f8.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = pvVar10;
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::~vector(&local_58);
          pvVar14 = local_e0.
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          pvVar7 = local_e0.
                   super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar10 = local_e0.
                    super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          if (local_e0.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish !=
              local_e0.
              super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            do {
              puVar4 = (pvVar10->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              if (puVar4 != (pointer)0x0) {
                operator_delete(puVar4,(long)(pvVar10->
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             )._M_impl.super__Vector_impl_data._M_end_of_storage -
                                       (long)puVar4);
              }
              pvVar10 = pvVar10 + 1;
            } while (pvVar10 != pvVar14);
            local_e0.
            super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = pvVar7;
          }
          if (0x1c < local_a4) {
            free(local_c0.indirect_contents.indirect);
          }
          local_180 = WITNESS_V0;
          goto LAB_00729fd5;
        }
      }
    }
    else {
LAB_00729fd5:
      pvVar7 = local_f8.
               super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if ((TVar9 == MULTISIG) &&
         (local_f8.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_f8.
          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)) {
        uVar12 = ((long)local_158.
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_158.
                        super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
        if (uVar12 < 2) {
          __assert_fail("solutions.size() > 1",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/sign.cpp"
                        ,0x291,
                        "SignatureData DataFromTransaction(const CMutableTransaction &, unsigned int, const CTxOut &)"
                       );
        }
        uVar15 = 0;
        pvVar14 = local_f8.
                  super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          uVar13 = (ulong)uVar15;
          lVar5 = uVar13 * 0x18;
          do {
            pvVar6 = local_158.
                     super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((int)uVar12 - 2 <= uVar13) goto LAB_0072a0df;
            CPubKey::Set<unsigned_char_const*>
                      ((CPubKey *)&local_c0,
                       *(uchar **)
                        ((long)&local_158.
                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[1].
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start + lVar5),
                       *(uchar **)
                        ((long)&local_158.
                                super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[1].
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish + lVar5));
            CPubKey::GetID((CKeyID *)&local_58,(CPubKey *)&local_c0);
            cVar11 = std::
                     _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                     ::find(&(__return_storage_ptr__->signatures)._M_t,(key_type *)&local_58);
            if ((_Rb_tree_header *)cVar11._M_node !=
                &(__return_storage_ptr__->signatures)._M_t._M_impl.super__Rb_tree_header) {
              uVar13 = (ulong)((int)uVar13 + 1);
              break;
            }
            bVar8 = anon_unknown.dwarf_2f3b8b2::SignatureExtractorChecker::CheckECDSASignature
                              (&local_138,pvVar14,
                               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               ((long)&pvVar6[1].
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       ._M_impl.super__Vector_impl_data._M_start + lVar5),
                               (CScript *)&local_78.indirect_contents,local_180);
            uVar13 = uVar13 + 1;
            lVar5 = lVar5 + 0x18;
          } while (!bVar8);
          uVar15 = (uint)uVar13;
LAB_0072a0df:
          pvVar14 = pvVar14 + 1;
        } while (pvVar14 != pvVar7);
      }
    }
  }
  if (0x1c < local_5c) {
    free(local_78.indirect_contents.indirect);
  }
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_158);
LAB_0072a113:
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_e0);
  std::
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::~vector(&local_f8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

SignatureData DataFromTransaction(const CMutableTransaction& tx, unsigned int nIn, const CTxOut& txout)
{
    SignatureData data;
    assert(tx.vin.size() > nIn);
    data.scriptSig = tx.vin[nIn].scriptSig;
    data.scriptWitness = tx.vin[nIn].scriptWitness;
    Stacks stack(data);

    // Get signatures
    MutableTransactionSignatureChecker tx_checker(&tx, nIn, txout.nValue, MissingDataBehavior::FAIL);
    SignatureExtractorChecker extractor_checker(data, tx_checker);
    if (VerifyScript(data.scriptSig, txout.scriptPubKey, &data.scriptWitness, STANDARD_SCRIPT_VERIFY_FLAGS, extractor_checker)) {
        data.complete = true;
        return data;
    }

    // Get scripts
    std::vector<std::vector<unsigned char>> solutions;
    TxoutType script_type = Solver(txout.scriptPubKey, solutions);
    SigVersion sigversion = SigVersion::BASE;
    CScript next_script = txout.scriptPubKey;

    if (script_type == TxoutType::SCRIPTHASH && !stack.script.empty() && !stack.script.back().empty()) {
        // Get the redeemScript
        CScript redeem_script(stack.script.back().begin(), stack.script.back().end());
        data.redeem_script = redeem_script;
        next_script = std::move(redeem_script);

        // Get redeemScript type
        script_type = Solver(next_script, solutions);
        stack.script.pop_back();
    }
    if (script_type == TxoutType::WITNESS_V0_SCRIPTHASH && !stack.witness.empty() && !stack.witness.back().empty()) {
        // Get the witnessScript
        CScript witness_script(stack.witness.back().begin(), stack.witness.back().end());
        data.witness_script = witness_script;
        next_script = std::move(witness_script);

        // Get witnessScript type
        script_type = Solver(next_script, solutions);
        stack.witness.pop_back();
        stack.script = std::move(stack.witness);
        stack.witness.clear();
        sigversion = SigVersion::WITNESS_V0;
    }
    if (script_type == TxoutType::MULTISIG && !stack.script.empty()) {
        // Build a map of pubkey -> signature by matching sigs to pubkeys:
        assert(solutions.size() > 1);
        unsigned int num_pubkeys = solutions.size()-2;
        unsigned int last_success_key = 0;
        for (const valtype& sig : stack.script) {
            for (unsigned int i = last_success_key; i < num_pubkeys; ++i) {
                const valtype& pubkey = solutions[i+1];
                // We either have a signature for this pubkey, or we have found a signature and it is valid
                if (data.signatures.count(CPubKey(pubkey).GetID()) || extractor_checker.CheckECDSASignature(sig, pubkey, next_script, sigversion)) {
                    last_success_key = i + 1;
                    break;
                }
            }
        }
    }

    return data;
}